

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
                  *this,vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
                        *list)

{
  bool bVar1;
  DecodeRawTransactionTxOut *in_RDI;
  DecodeRawTransactionTxOut object;
  DecodeRawTransactionTxOutStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
  *__range3;
  DecodeRawTransactionTxOutStruct *in_stack_fffffffffffffea8;
  value_type *in_stack_fffffffffffffeb8;
  vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  *in_stack_fffffffffffffec0;
  DecodeRawTransactionTxOut *in_stack_fffffffffffffed0;
  __normal_iterator<const_DecodeRawTransactionTxOutStruct_*,_std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (DecodeRawTransactionTxOutStruct *)
       std::
       vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>::
       begin(in_stack_fffffffffffffea8);
  std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>::
  end((vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_> *)
      in_stack_fffffffffffffea8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_DecodeRawTransactionTxOutStruct_*,_std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_DecodeRawTransactionTxOutStruct_*,_std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_DecodeRawTransactionTxOutStruct_*,_std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>_>
    ::operator*(local_20);
    in_stack_fffffffffffffea8 = (DecodeRawTransactionTxOutStruct *)&stack0xfffffffffffffec8;
    api::json::DecodeRawTransactionTxOut::DecodeRawTransactionTxOut(in_stack_fffffffffffffed0);
    api::json::DecodeRawTransactionTxOut::ConvertFromStruct(in_RDI,in_stack_fffffffffffffea8);
    std::
    vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
    ::push_back(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    api::json::DecodeRawTransactionTxOut::~DecodeRawTransactionTxOut(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_DecodeRawTransactionTxOutStruct_*,_std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }